

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImGuiListClipperData::Reset(ImGuiListClipperData *this,ImGuiListClipper *clipper)

{
  int *piVar1;
  ImGuiListClipperRange *pIVar2;
  ImGuiListClipperRange *__dest;
  
  this->ListClipper = clipper;
  this->StepNo = 0;
  this->ItemsFrozen = 0;
  if ((this->Ranges).Capacity < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    __dest = (ImGuiListClipperRange *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pIVar2 = (this->Ranges).Data;
    if (pIVar2 != (ImGuiListClipperRange *)0x0) {
      memcpy(__dest,pIVar2,(long)(this->Ranges).Size * 0xc);
      pIVar2 = (this->Ranges).Data;
      if ((pIVar2 != (ImGuiListClipperRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
    }
    (this->Ranges).Data = __dest;
    (this->Ranges).Capacity = 0;
  }
  (this->Ranges).Size = 0;
  return;
}

Assistant:

void                            Reset(ImGuiListClipper* clipper) { ListClipper = clipper; StepNo = ItemsFrozen = 0; Ranges.resize(0); }